

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::clear(Value *this)

{
  bool bVar1;
  Value *this_local;
  
  bVar1 = true;
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) &&
     (bVar1 = true, (*(ushort *)&this->field_0x8 & 0xff) != 6)) {
    bVar1 = (*(ushort *)&this->field_0x8 & 0xff) == 7;
  }
  if (bVar1) {
    if (this->field_0x8 == '\x06' || this->field_0x8 == '\a') {
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::clear((this->value_).map_);
    }
    return;
  }
  __assert_fail("type_ == nullValue || type_ == arrayValue || type_ == objectValue",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                ,0x402,"void Json::Value::clear()");
}

Assistant:

void 
Value::clear()
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue  || type_ == objectValue );

   switch ( type_ )
   {
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
   case objectValue:
      value_.map_->clear();
      break;
#else
   case arrayValue:
      value_.array_->clear();
      break;
   case objectValue:
      value_.map_->clear();
      break;
#endif
   default:
      break;
   }
}